

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O1

SENode * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetTripCount(LoopDependenceAnalysis *this,Loop *loop)

{
  bool bVar1;
  BasicBlock *condition_block;
  Instruction *induction;
  Instruction *pIVar2;
  SENode *pSVar3;
  size_t iteration_count;
  size_t local_28;
  
  condition_block = Loop::FindConditionBlock(loop);
  if (((condition_block != (BasicBlock *)0x0) &&
      (induction = Loop::FindConditionVariable(loop,condition_block),
      induction != (Instruction *)0x0)) &&
     (pIVar2 = Loop::GetConditionInst(loop), pIVar2 != (Instruction *)0x0)) {
    local_28 = 0;
    bVar1 = Loop::IsSupportedCondition(loop,pIVar2->opcode_);
    if (bVar1) {
      pIVar2 = (condition_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      if ((pIVar2 != (Instruction *)0x0) &&
         ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
        bVar1 = Loop::FindNumberOfIterations
                          (loop,induction,
                           (condition_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>
                           .sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.
                           previous_node_,&local_28,(int64_t *)0x0,(int64_t *)0x0);
        if (!bVar1) {
          return (SENode *)0x0;
        }
        pSVar3 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,local_28);
        return pSVar3;
      }
      __assert_fail("!insts_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                    ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
    }
  }
  return (SENode *)0x0;
}

Assistant:

SENode* LoopDependenceAnalysis::GetTripCount(const Loop* loop) {
  BasicBlock* condition_block = loop->FindConditionBlock();
  if (!condition_block) {
    return nullptr;
  }
  Instruction* induction_instr = loop->FindConditionVariable(condition_block);
  if (!induction_instr) {
    return nullptr;
  }
  Instruction* cond_instr = loop->GetConditionInst();
  if (!cond_instr) {
    return nullptr;
  }

  size_t iteration_count = 0;

  // We have to check the instruction type here. If the condition instruction
  // isn't a supported type we can't calculate the trip count.
  if (loop->IsSupportedCondition(cond_instr->opcode())) {
    if (loop->FindNumberOfIterations(induction_instr, &*condition_block->tail(),
                                     &iteration_count)) {
      return scalar_evolution_.CreateConstant(
          static_cast<int64_t>(iteration_count));
    }
  }

  return nullptr;
}